

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::SpotLight::operator==(SpotLight *this,SpotLight *other)

{
  bool bVar1;
  bool local_19;
  SpotLight *other_local;
  SpotLight *this_local;
  
  bVar1 = std::operator==(&this->extensions,&other->extensions);
  local_19 = false;
  if (bVar1) {
    bVar1 = Value::operator==(&this->extras,&other->extras);
    local_19 = false;
    if ((bVar1) && (local_19 = false, ABS(other->innerConeAngle - this->innerConeAngle) < 1e-12)) {
      local_19 = ABS(other->outerConeAngle - this->outerConeAngle) < 1e-12;
    }
  }
  return local_19;
}

Assistant:

bool SpotLight::operator==(const SpotLight &other) const {
  return this->extensions == other.extensions && this->extras == other.extras &&
         TINYGLTF_DOUBLE_EQUAL(this->innerConeAngle, other.innerConeAngle) &&
         TINYGLTF_DOUBLE_EQUAL(this->outerConeAngle, other.outerConeAngle);
}